

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::log_internal::EncodeBytesTruncate
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  Span<char> *pSVar1;
  anon_unknown_4 *this_00;
  Span<char> *buf_00;
  Span<char> *pSVar3;
  Span<char> *pSVar4;
  Span<char> *size;
  size_type sVar5;
  anon_unknown_4 *paVar6;
  Span<char> *pSVar7;
  undefined8 *size_00;
  Span<char> *value_00;
  undefined1 uVar8;
  uint64_t uVar9;
  Span<char> *this_01;
  uint64_t value_01;
  bool bVar10;
  Span<char> *pSVar2;
  
  size = (Span<char> *)value.len_;
  this_01 = (Span<char> *)value.ptr_;
  pSVar7 = (Span<char> *)((long)this * 8 + 2);
  uVar9 = 1;
  value_00 = (Span<char> *)0x1;
  pSVar2 = pSVar7;
  buf_00 = size;
  if (0x7f < (ulong)((long)this << 3)) {
    do {
      buf_00 = (Span<char> *)((ulong)pSVar2 >> 7);
      value_00 = (Span<char> *)((long)&value_00->ptr_ + 1);
      bVar10 = (Span<char> *)0x3fff < pSVar2;
      pSVar2 = buf_00;
    } while (bVar10);
  }
  pSVar2 = (Span<char> *)size->len_;
  pSVar3 = this_01;
  if (pSVar2 < this_01) {
    pSVar3 = pSVar2;
  }
  if ((Span<char> *)0x7f < pSVar3) {
    uVar9 = 1;
    do {
      buf_00 = (Span<char> *)((ulong)pSVar3 >> 7);
      uVar9 = uVar9 + 1;
      bVar10 = (Span<char> *)0x3fff < pSVar3;
      pSVar3 = buf_00;
    } while (bVar10);
  }
  pSVar3 = (Span<char> *)((long)&value_00->ptr_ + uVar9);
  if (((pSVar3 <= pSVar2) &&
      (pSVar1 = (Span<char> *)((long)&pSVar3->ptr_ + (long)&this_01->ptr_),
      pSVar4 = (Span<char> *)((long)pSVar1 - (long)pSVar2),
      pSVar2 <= pSVar1 && pSVar4 != (Span<char> *)0x0)) &&
     (bVar10 = this_01 < pSVar4, this_01 = (Span<char> *)((long)this_01 - (long)pSVar4), bVar10)) {
LAB_00367828:
    EncodeBytesTruncate();
    this_00 = (anon_unknown_4 *)((long)pSVar7 * 8 + 2);
    value_01 = 1;
    uVar9 = 1;
    paVar6 = this_00;
    if (0x7f < (ulong)((long)pSVar7 << 3)) {
      do {
        uVar9 = uVar9 + 1;
        bVar10 = (anon_unknown_4 *)0x3fff < paVar6;
        paVar6 = (anon_unknown_4 *)((ulong)paVar6 >> 7);
      } while (bVar10);
    }
    pSVar7 = (Span<char> *)size_00[1];
    if (pSVar7 < value_00) {
      value_00 = pSVar7;
    }
    if ((Span<char> *)0x7f < value_00) {
      value_01 = 1;
      do {
        value_01 = value_01 + 1;
        bVar10 = (Span<char> *)0x3fff < value_00;
        value_00 = (Span<char> *)((ulong)value_00 >> 7);
      } while (bVar10);
    }
    if (pSVar7 < (Span<char> *)(value_01 + uVar9)) {
      size_00[1] = 0;
      uVar8 = 0;
    }
    else {
      anon_unknown_4::EncodeRawVarint(this_00,uVar9,(size_t)size_00,pSVar7);
      uVar8 = (undefined1)*size_00;
      anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)0x0,value_01,(size_t)size_00,pSVar7);
    }
    return (bool)uVar8;
  }
  pSVar3 = (Span<char> *)((long)&this_01->ptr_ + (long)&pSVar3->ptr_);
  if (pSVar2 < pSVar3) {
    sVar5 = 0;
  }
  else {
    anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)pSVar7,(uint64_t)value_00,(size_t)size,buf_00)
    ;
    anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)this_01,uVar9,(size_t)size,buf_00);
    pSVar7 = (Span<char> *)size->ptr_;
    memcpy(pSVar7,(void *)tag,(size_t)this_01);
    sVar5 = (long)size->len_ - (long)this_01;
    if ((Span<char> *)size->len_ < this_01) {
      EncodeBytesTruncate();
      value_00 = (Span<char> *)tag;
      goto LAB_00367828;
    }
    size->ptr_ = (pointer)((long)&this_01->ptr_ + (long)size->ptr_);
  }
  size->len_ = sVar5;
  return pSVar3 <= pSVar2;
}

Assistant:

bool EncodeBytesTruncate(uint64_t tag, absl::Span<const char> value,
                         absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size =
      VarintSize(std::min<uint64_t>(length, buf->size()));
  if (tag_type_size + length_size <= buf->size() &&
      tag_type_size + length_size + value.size() > buf->size()) {
    value.remove_suffix(tag_type_size + length_size + value.size() -
                        buf->size());
    length = value.size();
  }
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}